

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O0

int __thiscall Ym2612_Impl::YM_SET(Ym2612_Impl *this,int Adr,int data)

{
  channel_t *ch_00;
  int iVar1;
  uint in_EDX;
  undefined4 in_ESI;
  Ym2612_Impl *in_RDI;
  channel_t *ch;
  int nch;
  uint local_1c;
  
  switch(in_ESI) {
  case 0x22:
    if ((in_EDX & 8) == 0) {
      (in_RDI->g).LFOcnt = 0;
      (in_RDI->g).LFOinc = 0;
    }
    else {
      (in_RDI->g).LFOinc = (in_RDI->g).LFO_INC_TAB[(int)(in_EDX & 7)];
    }
    break;
  case 0x24:
    (in_RDI->YM2612).TimerA = (in_RDI->YM2612).TimerA & 3U | in_EDX << 2;
    if ((in_RDI->YM2612).TimerAL != (0x400 - (in_RDI->YM2612).TimerA) * 0x1000) {
      iVar1 = (0x400 - (in_RDI->YM2612).TimerA) * 0x1000;
      (in_RDI->YM2612).TimerAL = iVar1;
      (in_RDI->YM2612).TimerAcnt = iVar1;
    }
    break;
  case 0x25:
    (in_RDI->YM2612).TimerA = (in_RDI->YM2612).TimerA & 0x3fcU | in_EDX & 3;
    if ((in_RDI->YM2612).TimerAL != (0x400 - (in_RDI->YM2612).TimerA) * 0x1000) {
      iVar1 = (0x400 - (in_RDI->YM2612).TimerA) * 0x1000;
      (in_RDI->YM2612).TimerAL = iVar1;
      (in_RDI->YM2612).TimerAcnt = iVar1;
    }
    break;
  case 0x26:
    (in_RDI->YM2612).TimerB = in_EDX;
    if ((in_RDI->YM2612).TimerBL != (0x100 - (in_RDI->YM2612).TimerB) * 0x10000) {
      iVar1 = (0x100 - (in_RDI->YM2612).TimerB) * 0x10000;
      (in_RDI->YM2612).TimerBL = iVar1;
      (in_RDI->YM2612).TimerBcnt = iVar1;
    }
    break;
  case 0x27:
    if (((in_EDX ^ (in_RDI->YM2612).Mode) & 0x40) != 0) {
      YM2612_Special_Update();
      (in_RDI->YM2612).CHANNEL[2].SLOT[0].Finc = -1;
    }
    (in_RDI->YM2612).Status =
         (int)(in_EDX ^ 0xffffffff) >> 4 & (int)in_EDX >> 2 & (in_RDI->YM2612).Status;
    (in_RDI->YM2612).Mode = in_EDX;
    break;
  case 0x28:
    local_1c = in_EDX & 3;
    if (local_1c == 3) {
      return 1;
    }
    if ((in_EDX & 4) != 0) {
      local_1c = local_1c + 3;
    }
    ch_00 = (in_RDI->YM2612).CHANNEL + (int)local_1c;
    YM2612_Special_Update();
    if ((in_EDX & 0x10) == 0) {
      KEY_OFF(in_RDI,ch_00,0);
    }
    else {
      KEY_ON(in_RDI,ch_00,0);
    }
    if ((in_EDX & 0x20) == 0) {
      KEY_OFF(in_RDI,ch_00,2);
    }
    else {
      KEY_ON(in_RDI,ch_00,2);
    }
    if ((in_EDX & 0x40) == 0) {
      KEY_OFF(in_RDI,ch_00,1);
    }
    else {
      KEY_ON(in_RDI,ch_00,1);
    }
    if ((in_EDX & 0x80) == 0) {
      KEY_OFF(in_RDI,ch_00,3);
    }
    else {
      KEY_ON(in_RDI,ch_00,3);
    }
    break;
  case 0x2b:
    if ((in_RDI->YM2612).DAC != (in_EDX & 0x80)) {
      YM2612_Special_Update();
    }
    (in_RDI->YM2612).DAC = in_EDX & 0x80;
  }
  return 0;
}

Assistant:

int Ym2612_Impl::YM_SET(int Adr, int data)
{
	switch ( Adr )
	{
		case 0x22:
			if (data & 8) // LFO enable
			{
				// Cool Spot music 1, LFO modified severals time which
				// distord the sound, have to check that on a real genesis...

				g.LFOinc = g.LFO_INC_TAB [data & 7];
			}
			else
			{
				g.LFOinc = g.LFOcnt = 0;
			}
			break;

		case 0x24:
			YM2612.TimerA = (YM2612.TimerA & 0x003) | (((int) data) << 2);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x25:
			YM2612.TimerA = (YM2612.TimerA & 0x3FC) | (data & 3);

			if (YM2612.TimerAL != (1024 - YM2612.TimerA) << 12)
			{
				YM2612.TimerAcnt = YM2612.TimerAL = (1024 - YM2612.TimerA) << 12;
			}
			break;

		case 0x26:
			YM2612.TimerB = data;

			if (YM2612.TimerBL != (256 - YM2612.TimerB) << (4 + 12))
			{
				YM2612.TimerBcnt = YM2612.TimerBL = (256 - YM2612.TimerB) << (4 + 12);
			}
			break;

		case 0x27:
			// Parametre divers
			// b7 = CSM MODE
			// b6 = 3 slot mode
			// b5 = reset b
			// b4 = reset a
			// b3 = timer enable b
			// b2 = timer enable a
			// b1 = load b
			// b0 = load a

			if ((data ^ YM2612.Mode) & 0x40)
			{
				// We changed the channel 2 mode, so recalculate phase step
				// This fix the punch sound in Street of Rage 2

				YM2612_Special_Update();

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;      // recalculate phase step
			}

//          if ((data & 2) && (YM2612.Status & 2)) YM2612.TimerBcnt = YM2612.TimerBL;
//          if ((data & 1) && (YM2612.Status & 1)) YM2612.TimerAcnt = YM2612.TimerAL;

//          YM2612.Status &= (~data >> 4);                  // Reset du Status au cas ou c'est demande
			YM2612.Status &= (~data >> 4) & (data >> 2);    // Reset Status

			YM2612.Mode = data;
			break;

		case 0x28: {
			int nch = data & 3;
			if ( nch == 3 )
				return 1;
			if ( data & 4 )
				nch += 3;
			channel_t& ch = YM2612.CHANNEL [nch];

			YM2612_Special_Update();

			if (data & 0x10) KEY_ON(ch, S0);    // On appuie sur la touche pour le slot 1
			else KEY_OFF(ch, S0);               // On rel'che la touche pour le slot 1
			if (data & 0x20) KEY_ON(ch, S1);    // On appuie sur la touche pour le slot 3
			else KEY_OFF(ch, S1);               // On rel'che la touche pour le slot 3
			if (data & 0x40) KEY_ON(ch, S2);    // On appuie sur la touche pour le slot 2
			else KEY_OFF(ch, S2);               // On rel'che la touche pour le slot 2
			if (data & 0x80) KEY_ON(ch, S3);    // On appuie sur la touche pour le slot 4
			else KEY_OFF(ch, S3);               // On rel'che la touche pour le slot 4
			break;
		}
		
		case 0x2B:
			if (YM2612.DAC ^ (data & 0x80)) YM2612_Special_Update();

			YM2612.DAC = data & 0x80;   // activation/desactivation du DAC
			break;
	}
	
	return 0;
}